

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string_t * __thiscall
el::base::DefaultLogBuilder::build_abi_cxx11_
          (string_t *__return_storage_ptr__,DefaultLogBuilder *this,LogMessage *logMessage,
          bool appendNewLine)

{
  undefined *puVar1;
  bool bVar2;
  VerboseLevel VVar3;
  Level LVar4;
  Logger *pLVar5;
  TypedConfigurations *this_00;
  string_t *psVar6;
  DateTime *this_01;
  SubsecondPrecision *format;
  string *psVar7;
  LineNumber LVar8;
  string_t *psVar9;
  element_type *peVar10;
  Mutex *pMVar11;
  vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_> *pvVar12;
  pointer pCVar13;
  char *pcVar14;
  FormatSpecifierValueResolver *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  allocator<char> local_401;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  undefined1 local_3f0 [8];
  string_t wcsFormatSpecifier;
  string local_3c8 [8];
  string fs;
  __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  local_3a0;
  const_iterator it;
  ScopedLock lock_;
  string_t local_388;
  allocator local_361;
  string_t local_360;
  allocator local_339;
  string_t local_338;
  char *local_318;
  char *buf_2;
  string_t local_308;
  allocator local_2e1;
  string_t local_2e0;
  char *local_2c0;
  char *buf_1;
  string_t local_2b0;
  allocator local_289;
  string_t local_288;
  char *local_268;
  char *buf;
  string_t local_258;
  allocator local_231;
  string_t local_230;
  allocator local_209;
  string_t local_208;
  allocator local_1e1;
  string_t local_1e0;
  allocator local_1b9;
  string_t local_1b8;
  string local_198;
  allocator local_171;
  string_t local_170;
  string local_150;
  string local_130;
  allocator local_109;
  string_t local_108;
  allocator local_e1;
  string_t local_e0;
  char *local_b0;
  char *bufLim;
  char buff [110];
  LogFormat *logFormat;
  TypedConfigurations *tc;
  bool appendNewLine_local;
  LogMessage *logMessage_local;
  DefaultLogBuilder *this_local;
  string_t *logLine;
  
  psVar9 = __return_storage_ptr__;
  pLVar5 = LogMessage::logger(logMessage);
  this_00 = Logger::typedConfigurations(pLVar5);
  LVar4 = LogMessage::level(logMessage);
  register0x00000000 = TypedConfigurations::logFormat(this_00,LVar4);
  buff[0x67] = '\0';
  psVar6 = LogFormat::format_abi_cxx11_(register0x00000000);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
  buff[0x58] = '\0';
  buff[0x59] = '\0';
  buff[0x5a] = '\0';
  buff[0x5b] = '\0';
  buff[0x5c] = '\0';
  buff[0x5d] = '\0';
  buff[0x5e] = '\0';
  buff[0x5f] = '\0';
  buff[0x60] = '\0';
  buff[0x61] = '\0';
  buff[0x62] = '\0';
  buff[99] = '\0';
  buff[100] = '\0';
  buff[0x65] = '\0';
  buff[0x48] = '\0';
  buff[0x49] = '\0';
  buff[0x4a] = '\0';
  buff[0x4b] = '\0';
  buff[0x4c] = '\0';
  buff[0x4d] = '\0';
  buff[0x4e] = '\0';
  buff[0x4f] = '\0';
  buff[0x50] = '\0';
  buff[0x51] = '\0';
  buff[0x52] = '\0';
  buff[0x53] = '\0';
  buff[0x54] = '\0';
  buff[0x55] = '\0';
  buff[0x56] = '\0';
  buff[0x57] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  buff[0x40] = '\0';
  buff[0x41] = '\0';
  buff[0x42] = '\0';
  buff[0x43] = '\0';
  buff[0x44] = '\0';
  buff[0x45] = '\0';
  buff[0x46] = '\0';
  buff[0x47] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  bufLim = (char *)0x0;
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  local_b0 = buff + 0x66;
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,AppName);
  puVar1 = consts::kAppNameFormatSpecifier;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,puVar1,&local_e1);
    pLVar5 = LogMessage::logger(logMessage);
    psVar7 = Logger::parentApplicationName_abi_cxx11_(pLVar5);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_e0,psVar7);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,ThreadId);
  puVar1 = consts::kThreadIdFormatSpecifier;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,puVar1,&local_109);
    peVar10 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)elStorage);
    threading::getCurrentThreadId_abi_cxx11_();
    Storage::getThreadName(&local_130,peVar10,&local_150);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_108,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,DateTime);
  puVar1 = consts::kDateTimeFormatSpecifier;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,puVar1,&local_171);
    LogFormat::dateTimeFormat_abi_cxx11_(stack0xffffffffffffffc8);
    this_01 = (DateTime *)std::__cxx11::string::c_str();
    LVar4 = LogMessage::level(logMessage);
    format = TypedConfigurations::subsecondPrecision(this_00,LVar4);
    utils::DateTime::getDateTime_abi_cxx11_
              (&local_198,this_01,(char *)format,(SubsecondPrecision *)psVar9);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_170,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,Function);
  puVar1 = consts::kLogFunctionFormatSpecifier;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,puVar1,&local_1b9);
    psVar7 = LogMessage::func_abi_cxx11_(logMessage);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_1b8,psVar7);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,File);
  if (bVar2) {
    utils::Str::clearBuff((char *)&bufLim,100);
    LogMessage::file_abi_cxx11_(logMessage);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    utils::File::buildStrippedFilename(pcVar14,(char *)&bufLim,100);
    puVar1 = consts::kLogFileFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,puVar1,&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,(char *)&bufLim,&local_209);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_1e0,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,FileBase);
  if (bVar2) {
    utils::Str::clearBuff((char *)&bufLim,100);
    psVar7 = LogMessage::file_abi_cxx11_(logMessage);
    utils::File::buildBaseFilename(psVar7,(char *)&bufLim,100,consts::kFilePathSeperator);
    puVar1 = consts::kLogFileBaseFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,puVar1,&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,(char *)&bufLim,(allocator *)((long)&buf + 7))
    ;
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_230,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)((long)&buf + 7));
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,Line);
  if (bVar2) {
    local_268 = utils::Str::clearBuff((char *)&bufLim,10);
    LVar8 = LogMessage::line(logMessage);
    local_268 = utils::Str::convertAndAddToBuff(LVar8,10,local_268,local_b0,false);
    puVar1 = consts::kLogLineFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,puVar1,&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2b0,(char *)&bufLim,(allocator *)((long)&buf_1 + 7));
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_288,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&buf_1 + 7));
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,Location);
  if (bVar2) {
    local_2c0 = utils::Str::clearBuff((char *)&bufLim,0x6e);
    LogMessage::file_abi_cxx11_(logMessage);
    pcVar14 = (char *)std::__cxx11::string::c_str();
    utils::File::buildStrippedFilename(pcVar14,(char *)&bufLim,100);
    local_2c0 = utils::Str::addToBuff((char *)&bufLim,local_2c0,local_b0);
    local_2c0 = utils::Str::addToBuff(":",local_2c0,local_b0);
    LVar8 = LogMessage::line(logMessage);
    local_2c0 = utils::Str::convertAndAddToBuff(LVar8,10,local_2c0,local_b0,false);
    puVar1 = consts::kLogLocationFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,puVar1,&local_2e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_308,(char *)&bufLim,(allocator *)((long)&buf_2 + 7));
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_2e0,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)((long)&buf_2 + 7));
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  }
  LVar4 = LogMessage::level(logMessage);
  if ((LVar4 == Verbose) &&
     (bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,VerboseLevel), bVar2)) {
    local_318 = utils::Str::clearBuff((char *)&bufLim,1);
    VVar3 = LogMessage::verboseLevel(logMessage);
    local_318 = utils::Str::convertAndAddToBuff((ulong)VVar3,1,local_318,local_b0,false);
    puVar1 = consts::kVerboseLevelFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_338,puVar1,&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,(char *)&bufLim,&local_361);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_338,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
  }
  bVar2 = LogFormat::hasFlag(stack0xffffffffffffffc8,LogMessage);
  pcVar14 = consts::kMessageFormatSpecifier;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_388,pcVar14,(allocator *)((long)&lock_._vptr_NoScopedLock + 7));
    psVar9 = LogMessage::message_abi_cxx11_(logMessage);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,&local_388,psVar9);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lock_._vptr_NoScopedLock + 7));
  }
  peVar10 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)elStorage);
  pMVar11 = Storage::customFormatSpecifiersLock(peVar10);
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&it,pMVar11);
  peVar10 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)elStorage);
  pvVar12 = Storage::customFormatSpecifiers(peVar10);
  local_3a0._M_current =
       (CustomFormatSpecifier *)
       utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
       begin(pvVar12);
  while( true ) {
    peVar10 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)elStorage);
    pvVar12 = Storage::customFormatSpecifiers(peVar10);
    fs.field_2._8_8_ =
         utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
         end(pvVar12);
    bVar2 = __gnu_cxx::operator!=
                      (&local_3a0,
                       (__normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                        *)((long)&fs.field_2 + 8));
    if (!bVar2) break;
    pCVar13 = __gnu_cxx::
              __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
              ::operator->(&local_3a0);
    pcVar14 = CustomFormatSpecifier::formatSpecifier(pCVar13);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3c8,pcVar14,(allocator *)(wcsFormatSpecifier.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(wcsFormatSpecifier.field_2._M_local_buf + 0xf));
    local_3f8._M_current = (char *)std::__cxx11::string::begin();
    local_400._M_current = (char *)std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)local_3f0,local_3f8,local_400,&local_401);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    pCVar13 = __gnu_cxx::
              __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
              ::operator->(&local_3a0);
    this_02 = CustomFormatSpecifier::resolver_abi_cxx11_(pCVar13);
    utils::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_el::LogMessage_*)>
    ::operator()(&local_428,this_02,logMessage);
    utils::Str::replaceFirstWithEscape(__return_storage_ptr__,(string_t *)local_3f0,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string(local_3c8);
    __gnu_cxx::
    __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
    ::operator++(&local_3a0);
  }
  if (appendNewLine) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  buff[0x67] = '\x01';
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&it);
  if ((buff[0x67] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

base::type::string_t DefaultLogBuilder::build(const LogMessage* logMessage, bool appendNewLine) const {
  base::TypedConfigurations* tc = logMessage->logger()->typedConfigurations();
  const base::LogFormat* logFormat = &tc->logFormat(logMessage->level());
  base::type::string_t logLine = logFormat->format();
  char buff[base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength] = "";
  const char* bufLim = buff + sizeof(buff);
  if (logFormat->hasFlag(base::FormatFlags::AppName)) {
    // App name
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kAppNameFormatSpecifier,
        logMessage->logger()->parentApplicationName());
  }
  if (logFormat->hasFlag(base::FormatFlags::ThreadId)) {
    // Thread ID
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kThreadIdFormatSpecifier,
        ELPP->getThreadName(base::threading::getCurrentThreadId()));
  }
  if (logFormat->hasFlag(base::FormatFlags::DateTime)) {
    // DateTime
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kDateTimeFormatSpecifier,
        base::utils::DateTime::getDateTime(logFormat->dateTimeFormat().c_str(),
                                           &tc->subsecondPrecision(logMessage->level())));
  }
  if (logFormat->hasFlag(base::FormatFlags::Function)) {
    // Function
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFunctionFormatSpecifier, logMessage->func());
  }
  if (logFormat->hasFlag(base::FormatFlags::File)) {
    // File
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::FileBase)) {
    // FileBase
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildBaseFilename(logMessage->file(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileBaseFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Line)) {
    // Line
    char* buf = base::utils::Str::clearBuff(buff, base::consts::kSourceLineMaxLength);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(), base::consts::kSourceLineMaxLength, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLineFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Location)) {
    // Location
    char* buf = base::utils::Str::clearBuff(buff,
                                            base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    buf = base::utils::Str::addToBuff(buff, buf, bufLim);
    buf = base::utils::Str::addToBuff(":", buf, bufLim);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(),  base::consts::kSourceLineMaxLength, buf, bufLim,
          false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLocationFormatSpecifier, std::string(buff));
  }
  if (logMessage->level() == Level::Verbose && logFormat->hasFlag(base::FormatFlags::VerboseLevel)) {
    // Verbose level
    char* buf = base::utils::Str::clearBuff(buff, 1);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->verboseLevel(), 1, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kVerboseLevelFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::LogMessage)) {
    // Log message
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kMessageFormatSpecifier, logMessage->message());
  }
#if !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  el::base::threading::ScopedLock lock_(ELPP->customFormatSpecifiersLock());
  ELPP_UNUSED(lock_);
  for (std::vector<CustomFormatSpecifier>::const_iterator it = ELPP->customFormatSpecifiers()->begin();
       it != ELPP->customFormatSpecifiers()->end(); ++it) {
    std::string fs(it->formatSpecifier());
    base::type::string_t wcsFormatSpecifier(fs.begin(), fs.end());
    base::utils::Str::replaceFirstWithEscape(logLine, wcsFormatSpecifier, it->resolver()(logMessage));
  }
#endif  // !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  if (appendNewLine) logLine += ELPP_LITERAL("\n");
  return logLine;
}